

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QuadraticLikeCost.cpp
# Opt level: O2

bool __thiscall
iDynTree::optimalcontrol::QuadraticLikeCost::costFirstPartialDerivativeWRTState
          (QuadraticLikeCost *this,double time,VectorDynSize *state,VectorDynSize *param_3,
          VectorDynSize *partialDerivative)

{
  element_type *peVar1;
  element_type *peVar2;
  int iVar3;
  undefined4 extraout_var;
  long lVar4;
  long lVar5;
  undefined4 extraout_var_00;
  ostream *poVar6;
  bool isValid;
  ostringstream errorMsg;
  char local_249;
  double local_248;
  Map<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_> local_240;
  PointerType local_220;
  PointerType local_218;
  long lStack_210;
  long local_208;
  Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> local_1f8;
  MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Map<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::Transpose<Eigen::Map<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>_>_>,_Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>_>
  local_1e0 [8];
  long local_1d8;
  long local_1d0;
  undefined8 local_1c8;
  PointerType local_1c0;
  long lStack_1b8;
  long local_1b0;
  PointerType local_1a0;
  long local_198;
  long local_190;
  PointerType local_170;
  long lStack_168;
  undefined1 local_160;
  MatrixBase<Eigen::Map<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>> local_68 [24];
  Map<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_> local_50;
  
  local_248 = time;
  iDynTree::VectorDynSize::size();
  iDynTree::VectorDynSize::resize((ulong)partialDerivative);
  iDynTree::VectorDynSize::zero();
  local_249 = '\0';
  peVar1 = (this->m_timeVaryingStateHessian).
           super___shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::MatrixDynSize>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  if (peVar1 != (element_type *)0x0) {
    iVar3 = (*peVar1->_vptr_TimeVaryingObject[2])(SUB84(local_248,0),peVar1,&local_249);
    if (local_249 == '\0') {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e0);
      std::operator<<((ostream *)local_1e0,"Unable to retrieve a valid state hessian at time: ");
      poVar6 = std::ostream::_M_insert<double>(local_248);
      std::operator<<(poVar6,".");
      std::__cxx11::stringbuf::str();
      iDynTree::reportError
                ("QuadraticLikeCost","costFirstPartialDerivativeWRTState",
                 (char *)local_240.
                         super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                         .m_data);
      goto LAB_00196836;
    }
    lVar4 = iDynTree::MatrixDynSize::rows();
    lVar5 = iDynTree::MatrixDynSize::cols();
    if (lVar4 != lVar5) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e0);
      std::operator<<((ostream *)local_1e0,"The state hessian at time: ");
      poVar6 = std::ostream::_M_insert<double>(local_248);
      std::operator<<(poVar6," is not squared.");
      std::__cxx11::stringbuf::str();
      iDynTree::reportError
                ("QuadraticLikeCost","costFirstPartialDerivativeWRTState",
                 (char *)local_240.
                         super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                         .m_data);
      goto LAB_00196836;
    }
    lVar4 = iDynTree::MatrixDynSize::rows();
    lVar5 = iDynTree::VectorDynSize::size();
    if (lVar4 != lVar5) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e0);
      std::operator<<((ostream *)local_1e0,"The hessian at time: ");
      poVar6 = std::ostream::_M_insert<double>(local_248);
      std::operator<<(poVar6," does not match the state dimension.");
      std::__cxx11::stringbuf::str();
      iDynTree::reportError
                ("QuadraticLikeCost","costFirstPartialDerivativeWRTState",
                 (char *)local_240.
                         super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                         .m_data);
      goto LAB_00196836;
    }
    toEigen(&local_240,(MatrixDynSize *)CONCAT44(extraout_var,iVar3));
    toEigen(&local_50,(MatrixDynSize *)CONCAT44(extraout_var,iVar3));
    local_220 = local_50.
                super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                .m_data;
    local_218 = local_240.
                super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                .m_data;
    lStack_210 = local_240.
                 super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                 .m_rows.m_value;
    local_208 = local_240.
                super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                .m_cols.m_value;
    toEigen(&local_1f8,state);
    local_1d8 = local_50.
                super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                .m_cols.m_value;
    local_1d0 = local_50.
                super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                .m_rows.m_value;
    local_1c8 = 0x3fe0000000000000;
    local_1c0 = local_218;
    lStack_1b8 = lStack_210;
    local_1b0 = local_208;
    local_1a0 = local_220;
    local_198 = local_50.
                super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                .m_rows.m_value;
    local_190 = local_50.
                super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                .m_cols.m_value;
    local_170 = local_1f8.
                super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
                .m_data;
    lStack_168 = local_1f8.
                 super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
                 .m_rows.m_value;
    local_160 = local_1f8.
                super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
                ._16_1_;
    toEigen((Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> *)local_68,
            partialDerivative);
    Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<double,-1,1,0,-1,1>,0,Eigen::Stride<0,0>>>::
    operator+=(local_68,local_1e0);
  }
  peVar2 = (this->m_timeVaryingStateGradient).
           super___shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::VectorDynSize>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  if (peVar2 == (element_type *)0x0) {
    return true;
  }
  local_249 = '\0';
  iVar3 = (*peVar2->_vptr_TimeVaryingObject[2])(SUB84(local_248,0),peVar2,&local_249);
  if (local_249 == '\0') {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e0);
    std::operator<<((ostream *)local_1e0,"Unable to retrieve a valid state gradient at time: ");
    poVar6 = std::ostream::_M_insert<double>(local_248);
    std::operator<<(poVar6,".");
    std::__cxx11::stringbuf::str();
    iDynTree::reportError
              ("QuadraticLikeCost","costFirstPartialDerivativeWRTState",
               (char *)local_240.
                       super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                       .m_data);
  }
  else {
    lVar4 = iDynTree::VectorDynSize::size();
    lVar5 = iDynTree::VectorDynSize::size();
    if (lVar4 == lVar5) {
      toEigen((Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> *)
              local_1e0,(VectorDynSize *)CONCAT44(extraout_var_00,iVar3));
      toEigen((Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> *)&local_240,
              partialDerivative);
      Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<double,-1,1,0,-1,1>,0,Eigen::Stride<0,0>>>::
      operator+=((MatrixBase<Eigen::Map<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>> *)
                 &local_240,
                 (MatrixBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
                  *)local_1e0);
      return true;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e0);
    std::operator<<((ostream *)local_1e0,"The state and the gradient at time: ");
    poVar6 = std::ostream::_M_insert<double>(local_248);
    std::operator<<(poVar6," have different dimensions.");
    std::__cxx11::stringbuf::str();
    iDynTree::reportError
              ("QuadraticLikeCost","costFirstPartialDerivativeWRTState",
               (char *)local_240.
                       super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                       .m_data);
  }
LAB_00196836:
  std::__cxx11::string::~string((string *)&local_240);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e0);
  return false;
}

Assistant:

bool QuadraticLikeCost::costFirstPartialDerivativeWRTState(double time,
                                                               const iDynTree::VectorDynSize& state,
                                                               const iDynTree::VectorDynSize& /*control*/,
                                                               iDynTree::VectorDynSize& partialDerivative)
        {
            partialDerivative.resize(state.size());
            partialDerivative.zero();

            bool isValid = false;

            if (m_timeVaryingStateHessian) {

                const MatrixDynSize &hessian = m_timeVaryingStateHessian->get(time, isValid);

                if (!isValid) {
                    std::ostringstream errorMsg;
                    errorMsg << "Unable to retrieve a valid state hessian at time: " << time << ".";
                    reportError("QuadraticLikeCost", "costFirstPartialDerivativeWRTState", errorMsg.str().c_str());
                    return false;
                }

                if (hessian.rows() != hessian.cols()) {
                    std::ostringstream errorMsg;
                    errorMsg << "The state hessian at time: " << time << " is not squared.";
                    reportError("QuadraticLikeCost", "costFirstPartialDerivativeWRTState", errorMsg.str().c_str());
                    return false;
                }

                if (hessian.rows() != state.size()) {
                    std::ostringstream errorMsg;
                    errorMsg << "The hessian at time: " << time << " does not match the state dimension.";
                    reportError("QuadraticLikeCost", "costFirstPartialDerivativeWRTState", errorMsg.str().c_str());
                    return false;
                }
                toEigen(partialDerivative) += 0.5 * (toEigen(hessian) + toEigen(hessian).transpose()) * toEigen(state);
            }

            if (m_timeVaryingStateGradient) {

                isValid = false;
                const VectorDynSize &gradient = m_timeVaryingStateGradient->get(time, isValid);

                if (!isValid) {
                    std::ostringstream errorMsg;
                    errorMsg << "Unable to retrieve a valid state gradient at time: " << time << ".";
                    reportError("QuadraticLikeCost", "costFirstPartialDerivativeWRTState", errorMsg.str().c_str());
                    return false;
                }

                if (state.size() != gradient.size()) {
                    std::ostringstream errorMsg;
                    errorMsg << "The state and the gradient at time: " << time << " have different dimensions.";
                    reportError("QuadraticLikeCost", "costFirstPartialDerivativeWRTState", errorMsg.str().c_str());
                    return false;
                }

                toEigen(partialDerivative) += toEigen(gradient);
            }

            return true;
        }